

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# http.c++
# Opt level: O0

Promise<void> __thiscall kj::WebSocket::pumpTo(WebSocket *this,WebSocket *other)

{
  NullableValue<kj::Promise<void>_> *other_00;
  Promise<void> *pPVar1;
  anon_union_8_1_a8c68091_for_NullableValue<kj::Promise<void>_>_2 in_RDX;
  anon_union_8_1_a8c68091_for_NullableValue<kj::Promise<void>_>_2 local_70;
  WebSocket *local_68;
  undefined4 local_5c;
  Promise<void> *local_58;
  Promise<void> *p;
  Maybe<kj::Promise<void>_> local_40;
  undefined1 local_30 [8];
  NullableValue<kj::Promise<void>_> _p3796;
  WebSocket *other_local;
  WebSocket *this_local;
  
  _p3796.field_1 = in_RDX;
  (**(code **)(*(long *)in_RDX + 0x40))();
  other_00 = kj::_::readMaybe<kj::Promise<void>>(&local_40);
  kj::_::NullableValue<kj::Promise<void>_>::NullableValue
            ((NullableValue<kj::Promise<void>_> *)local_30,other_00);
  Maybe<kj::Promise<void>_>::~Maybe(&local_40);
  pPVar1 = kj::_::NullableValue::operator_cast_to_Promise_((NullableValue *)local_30);
  if (pPVar1 == (Promise<void> *)0x0) {
    local_70 = _p3796.field_1;
    local_68 = other;
    evalNow<kj::WebSocket::pumpTo(kj::WebSocket&)::__0>
              ((kj *)this,(anon_class_16_2_fc5a1845 *)&local_70.value);
  }
  else {
    local_58 = kj::_::NullableValue<kj::Promise<void>_>::operator*
                         ((NullableValue<kj::Promise<void>_> *)local_30);
    pPVar1 = mv<kj::Promise<void>>(local_58);
    Promise<void>::Promise((Promise<void> *)this,pPVar1);
  }
  local_5c = 1;
  kj::_::NullableValue<kj::Promise<void>_>::~NullableValue
            ((NullableValue<kj::Promise<void>_> *)local_30);
  return (PromiseBase)(PromiseBase)this;
}

Assistant:

kj::Promise<void> WebSocket::pumpTo(WebSocket& other) {
  KJ_IF_SOME(p, other.tryPumpFrom(*this)) {
    // Yay, optimized pump!
    return kj::mv(p);
  } else {
    // Fall back to default implementation.
    return kj::evalNow([&]() {
      auto cancelPromise = other.whenAborted().then([this]() -> kj::Promise<void> {
        this->abort();
        return KJ_EXCEPTION(DISCONNECTED,
            "destination of WebSocket pump disconnected prematurely");
      });
      return pumpWebSocketLoop(*this, other).exclusiveJoin(kj::mv(cancelPromise));
    });
  }
}